

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

bool wasm::hasActiveSegments(Module *wasm)

{
  pointer puVar1;
  ulong uVar2;
  ulong uVar3;
  Index i;
  ulong uVar4;
  
  puVar1 = (wasm->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(wasm->dataSegments).
                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    if (uVar3 <= uVar4) break;
    uVar2 = (ulong)((int)uVar4 + 1);
  } while (*(char *)((long)puVar1[uVar4]._M_t.
                           super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                           ._M_t + 0x28) != '\0');
  return uVar4 < uVar3;
}

Assistant:

bool hasActiveSegments(Module& wasm) {
  for (Index i = 0; i < wasm.dataSegments.size(); i++) {
    if (!wasm.dataSegments[i]->isPassive) {
      return true;
    }
  }
  return false;
}